

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chromecast.h
# Opt level: O0

bool cc::sendMessage(Connection *conn,string *ns,string *message)

{
  bool bVar1;
  ostream *poVar2;
  ulong uVar3;
  size_t sVar4;
  uchar *puVar5;
  undefined1 local_160 [8];
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
  contents;
  undefined1 local_138 [8];
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
  buffer;
  uint32_t byteSize;
  undefined1 local_e0 [8];
  CastMessage msg;
  string *message_local;
  string *ns_local;
  Connection *conn_local;
  
  msg._payload_binary.field_2._8_8_ = message;
  if (s_verbose) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Sending to \'");
    poVar2 = std::operator<<(poVar2,(string *)dest_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,"\': \'");
    poVar2 = std::operator<<(poVar2,(string *)ns);
    poVar2 = std::operator<<(poVar2,": \'");
    poVar2 = std::operator<<(poVar2,(string *)msg._payload_binary.field_2._8_8_);
    poVar2 = std::operator<<(poVar2,"\'");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  CastMessage::CastMessage((CastMessage *)local_e0);
  msg._namespace.field_2._8_4_ = 0;
  msg._4_4_ = 0;
  std::__cxx11::string::operator=
            ((string *)(msg._destination_id.field_2._M_local_buf + 8),(string *)ns);
  std::__cxx11::string::operator=((string *)&msg.field_0x8,"sender-0");
  uVar3 = std::__cxx11::string::empty();
  buffer.field_2._M_local_buf[0xe] = '\0';
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::string((string *)&byteSize,(string *)dest_abi_cxx11_);
  }
  else {
    std::allocator<char>::allocator();
    buffer.field_2._M_local_buf[0xe] = '\x01';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&byteSize,"receiver-0",
               (allocator<char> *)(buffer.field_2._M_local_buf + 0xf));
  }
  std::__cxx11::string::operator=
            ((string *)(msg._source_id.field_2._M_local_buf + 8),(string *)&byteSize);
  std::__cxx11::string::~string((string *)&byteSize);
  if ((buffer.field_2._M_local_buf[0xe] & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)(buffer.field_2._M_local_buf + 0xf));
  }
  std::__cxx11::string::operator=
            ((string *)&msg._payload_type,(string *)msg._payload_binary.field_2._8_8_);
  sVar4 = ec::
          cls_protoc3<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
          ::size((cls_protoc3<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
                  *)local_e0);
  buffer.field_2._8_4_ = htonl((uint32_t)sVar4);
  std::allocator<unsigned_char>::allocator
            ((allocator<unsigned_char> *)(contents.field_2._M_local_buf + 0xf));
  std::__cxx11::
  basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>::
  basic_string<std::allocator<unsigned_char>>
            ((basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>
              *)local_138,4,'\0',(allocator<unsigned_char> *)(contents.field_2._M_local_buf + 0xf));
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)(contents.field_2._M_local_buf + 0xf));
  puVar5 = std::__cxx11::
           basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
           ::data((basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                   *)local_138);
  *(undefined4 *)puVar5 = buffer.field_2._8_4_;
  std::__cxx11::
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
  basic_string((basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                *)local_160);
  std::__cxx11::
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
  reserve((basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
           *)local_160,0x400);
  bVar1 = ec::
          cls_protoc3<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
          ::serialize((cls_protoc3<std::__cxx11::basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>_>
                       *)local_e0,
                      (basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                       *)local_138);
  if (bVar1) {
    conn_local._7_1_ =
         Connection::write<unsigned_char>
                   (conn,(basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                          *)local_138);
  }
  else {
    puts("Failed to serialize");
    conn_local._7_1_ = false;
  }
  std::__cxx11::
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
  ~basic_string((basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                 *)local_160);
  std::__cxx11::
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
  ~basic_string((basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>
                 *)local_138);
  CastMessage::~CastMessage((CastMessage *)local_e0);
  return conn_local._7_1_;
}

Assistant:

bool sendMessage(const Connection &conn, const std::string &ns, const std::string &message)
{
    if (s_verbose) {
        std::cout << "Sending to '" << dest << "': '" << ns << ": '" << message << "'" << std::endl;
    }

    CastMessage msg;
    msg._payload_type = CastMessage::STRING;
    msg._protocol_version = CastMessage::CASTV2_1_0;
    msg._namespace = ns;
    msg._source_id = "sender-0";
    msg._destination_id = dest.empty() ? "receiver-0" : dest;
    msg._payload_utf8 = message;

    const uint32_t byteSize = htonl(uint32_t(msg.size()));
    std::basic_string<uint8_t> buffer(sizeof byteSize, '\0');
    memcpy(buffer.data(), &byteSize, sizeof byteSize);

    std::basic_string<uint8_t> contents;
    contents.reserve(1024);
    if (!msg.serialize(&buffer)) {
        puts("Failed to serialize");
        return false;
    }
    return conn.write(buffer);
}